

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts float_to_float(FloatParts a,FloatFmt *dstf,float_status *s)

{
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  FloatParts FVar4;
  FloatFmt *local_48;
  float_status *s_local;
  FloatFmt *dstf_local;
  FloatParts a_local;
  undefined8 local_10;
  
  dstf_local = (FloatFmt *)a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_4_ = a._12_4_;
  uVar1 = a_local.frac._4_4_;
  a_local.frac._4_1_ = a.cls;
  if ((dstf->arm_althp & 1U) == 0) {
    _Var2 = is_nan(a_local.frac._4_1_);
    if (_Var2) {
      _Var2 = is_snan(a_local.frac._4_1_);
      a_local.frac._4_4_ = uVar1;
      if (_Var2) {
        s->float_exception_flags = s->float_exception_flags | 1;
        FVar4 = parts_silence_nan(a,s);
        local_48 = (FloatFmt *)FVar4.frac;
        dstf_local = local_48;
        a_local.frac._0_4_ = FVar4.exp;
        a_local.frac._4_4_ = FVar4._12_4_;
      }
      uVar1 = a_local.frac._4_4_;
      if (s->default_nan_mode != '\0') {
        FVar4 = parts_default_nan(s);
        return FVar4;
      }
    }
  }
  else {
    uVar3 = uVar1 & 0xff;
    a_local.frac._5_3_ = a._13_3_;
    if (uVar3 == 3) {
      s->float_exception_flags = s->float_exception_flags | 1;
      a_local.frac._4_1_ = 2;
      a_local.frac._0_4_ = dstf->exp_max;
      dstf_local = (FloatFmt *)
                   ((1L << ((byte)dstf->frac_size & 0x3f)) + -1 << ((byte)dstf->frac_shift & 0x3f));
      uVar1 = a_local.frac._4_4_;
    }
    else if (uVar3 == 4 || uVar3 == 5) {
      s->float_exception_flags = s->float_exception_flags | 1;
      a_local.frac._4_1_ = 1;
      dstf_local = (FloatFmt *)0x0;
      a_local.frac._0_4_ = 0;
      uVar1 = a_local.frac._4_4_;
    }
  }
  a_local.frac._4_4_ = uVar1;
  local_10._4_1_ = a_local.frac._4_1_;
  local_10._5_1_ = (_Bool)a_local.frac._5_1_;
  local_10._6_2_ = a_local.frac._6_2_;
  local_10._0_4_ = (int)a_local.frac;
  a_local._8_8_ = dstf_local;
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts float_to_float(FloatParts a, const FloatFmt *dstf,
                                 float_status *s)
{
    if (dstf->arm_althp) {
        switch (a.cls) {
        case float_class_qnan:
        case float_class_snan:
            /* There is no NaN in the destination format.  Raise Invalid
             * and return a zero with the sign of the input NaN.
             */
            s->float_exception_flags |= float_flag_invalid;
            a.cls = float_class_zero;
            a.frac = 0;
            a.exp = 0;
            break;

        case float_class_inf:
            /* There is no Inf in the destination format.  Raise Invalid
             * and return the maximum normal with the correct sign.
             */
            s->float_exception_flags |= float_flag_invalid;
            a.cls = float_class_normal;
            a.exp = dstf->exp_max;
            a.frac = ((1ull << dstf->frac_size) - 1) << dstf->frac_shift;
            break;

        default:
            break;
        }
    } else if (is_nan(a.cls)) {
        if (is_snan(a.cls)) {
            s->float_exception_flags |= float_flag_invalid;
            a = parts_silence_nan(a, s);
        }
        if (s->default_nan_mode) {
            return parts_default_nan(s);
        }
    }
    return a;
}